

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::clear
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,allocator_type *alloc)

{
  uintptr_t uVar1;
  uint32_t uVar2;
  size_t i_2;
  size_type sVar3;
  long lVar4;
  FreeNode *pFVar5;
  FreeNode *pFVar6;
  EVP_PKEY_CTX *ctx;
  IntervalMap<unsigned_long,_std::monostate,_0U> *args;
  uint32_t i;
  ulong uVar7;
  size_t i_1;
  size_type sVar8;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> refs;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> nextRefs;
  
  if (this->height != 0) {
    refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.data_ =
         (pointer)refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.firstElement;
    refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.len = 0;
    refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.cap = 5;
    nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.data_ =
         (pointer)nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.firstElement;
    nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.len = 0;
    nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.cap = 5;
    args = this;
    for (uVar7 = 0; uVar7 < this->rootSize; uVar7 = uVar7 + 1) {
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
      emplace_back<slang::IntervalMapDetails::NodeRef_const&>
                (&refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>,(NodeRef *)args);
      args = (IntervalMap<unsigned_long,_std::monostate,_0U> *)
             &(args->field_0).rootLeaf.
              super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
              .first[0].right;
    }
    uVar2 = this->height;
    while( true ) {
      sVar3 = refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.len;
      uVar2 = uVar2 - 1;
      if (uVar2 == 0) break;
      for (sVar8 = 0; sVar8 != sVar3; sVar8 = sVar8 + 1) {
        uVar1 = refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.data_[sVar8].pip.
                value;
        for (lVar4 = 0;
            pFVar5 = (FreeNode *)
                     (refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.data_[sVar8].
                      pip.value & 0xffffffffffffffc0), (ulong)((uint)uVar1 & 0x3f) * 8 + 8 != lVar4;
            lVar4 = lVar4 + 8) {
          SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
          emplace_back<slang::IntervalMapDetails::NodeRef_const&>
                    (&nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>,
                     (NodeRef *)((long)&pFVar5->next + lVar4));
        }
        pFVar5->next = alloc->freeList;
        alloc->freeList = pFVar5;
      }
      refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.len = 0;
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
                (&refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>,
                 &nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>);
    }
    pFVar5 = alloc->freeList;
    for (sVar3 = 0; refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.len != sVar3;
        sVar3 = sVar3 + 1) {
      pFVar6 = (FreeNode *)
               (refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>.data_[sVar3].pip.
                value & 0xffffffffffffffc0);
      pFVar6->next = pFVar5;
      alloc->freeList = pFVar6;
      pFVar5 = pFVar6;
    }
    ctx = (EVP_PKEY_CTX *)0x0;
    memset(this,0,0xc4);
    SmallVectorBase<slang::IntervalMapDetails::NodeRef>::cleanup
              (&nextRefs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>,ctx);
    SmallVectorBase<slang::IntervalMapDetails::NodeRef>::cleanup
              (&refs.super_SmallVectorBase<slang::IntervalMapDetails::NodeRef>,ctx);
  }
  this->rootSize = 0;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::clear(allocator_type& alloc) {
    using namespace IntervalMapDetails;
    if (!isFlat()) {
        // Collect level 0 nodes from the root.
        SmallVector<NodeRef> refs, nextRefs;
        for (uint32_t i = 0; i < rootSize; i++)
            refs.push_back(rootBranch.childAt(i));

        // Visit all branch nodes.
        for (uint32_t h = height - 1; h > 0; h--) {
            for (size_t i = 0, e = refs.size(); i != e; i++) {
                for (size_t j = 0, s = refs[i].size(); j != s; j++)
                    nextRefs.push_back(refs[i].childAt(uint32_t(j)));

                alloc.destroy(&refs[i].get<Branch>());
            }

            refs.clear();
            refs.swap(nextRefs);
        }

        // Visit all leaf nodes.
        for (size_t i = 0, e = refs.size(); i != e; i++)
            alloc.destroy(&refs[i].get<Leaf>());

        switchToLeaf();
    }
    rootSize = 0;
}